

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

cbtScalar __thiscall
cbtCollisionWorld::objectQuerySingleInternal::BridgeTriangleConvexcastCallback::reportHit
          (BridgeTriangleConvexcastCallback *this,cbtVector3 *hitNormalLocal,
          cbtVector3 *hitPointLocal,cbtScalar hitFraction,int partId,int triangleIndex)

{
  ConvexResultCallback *pCVar1;
  cbtScalar extraout_XMM0_Da;
  LocalShapeInfo shapeInfo;
  LocalConvexResult convexResult;
  
  pCVar1 = this->m_resultCallback;
  if (hitFraction <= pCVar1->m_closestHitFraction) {
    convexResult.m_hitCollisionObject = this->m_collisionObject;
    convexResult.m_localShapeInfo = &shapeInfo;
    convexResult.m_hitNormalLocal.m_floats._0_8_ = *(undefined8 *)hitNormalLocal->m_floats;
    convexResult.m_hitNormalLocal.m_floats._8_8_ = *(undefined8 *)(hitNormalLocal->m_floats + 2);
    convexResult.m_hitPointLocal.m_floats._0_8_ = *(undefined8 *)hitPointLocal->m_floats;
    convexResult.m_hitPointLocal.m_floats._8_8_ = *(undefined8 *)(hitPointLocal->m_floats + 2);
    shapeInfo.m_shapePart = partId;
    shapeInfo.m_triangleIndex = triangleIndex;
    convexResult.m_hitFraction = hitFraction;
    (*pCVar1->_vptr_ConvexResultCallback[3])(pCVar1,&convexResult,1);
    hitFraction = extraout_XMM0_Da;
  }
  return hitFraction;
}

Assistant:

virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{
							cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																			 &shapeInfo,
																			 hitNormalLocal,
																			 hitPointLocal,
																			 hitFraction);

							bool normalInWorldSpace = true;

							return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
						}
						return hitFraction;
					}